

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htable.c
# Opt level: O1

HTABLE_NODE *
htable_remove(HTABLE *htable,HTABLE_NODE *key,HTABLE_CMP_FUNC cmp_func,HTABLE_HASH_FUNC hash_func)

{
  int iVar1;
  HTABLE_NODE *pHVar2;
  void *pvVar3;
  void *__ptr;
  long *plVar4;
  long lVar5;
  HTABLE_NODE *pHVar6;
  HTABLE_NODE *pHVar7;
  uint32_t uVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  HTABLE_NODE *pHVar12;
  int iVar13;
  long *plVar14;
  uint uVar15;
  HTABLE_NODE *local_40;
  HTABLE_NODE *local_38;
  
  uVar8 = (*hash_func)(key);
  uVar15 = htable->n_planes;
  do {
    if ((int)uVar15 < 1) {
      local_40 = (HTABLE_NODE *)0x0;
      break;
    }
    uVar15 = uVar15 - 1;
    pHVar2 = (HTABLE_NODE *)
             (((ulong)uVar8 % (ulong)(uint)(0x3b << ((byte)uVar15 & 0x1f))) * 8 +
             (long)htable->planes[uVar15]);
    do {
      pHVar12 = pHVar2;
      pHVar2 = pHVar12->next;
      pHVar6 = local_40;
      pHVar7 = local_38;
      if (pHVar2 == (HTABLE_NODE *)0x0) break;
      iVar9 = (*cmp_func)(key,pHVar2);
      pHVar6 = pHVar2;
      pHVar7 = pHVar12;
    } while (iVar9 != 0);
    local_38 = pHVar7;
    local_40 = pHVar6;
  } while (pHVar2 == (HTABLE_NODE *)0x0);
  if (local_40 == (HTABLE_NODE *)0x0) {
    local_40 = (HTABLE_NODE *)0x0;
  }
  else {
    local_38->next = local_40->next;
    uVar10 = htable->n - 1;
    htable->n = uVar10;
    iVar1 = htable->n_planes;
    iVar13 = 0x3b << ((byte)iVar1 & 0x1f);
    iVar9 = iVar13 + -0x3b;
    iVar13 = iVar13 + -0x38;
    if (-1 < iVar9) {
      iVar13 = iVar9;
    }
    if (uVar10 < (ulong)(long)(iVar13 >> 2)) {
      if (uVar10 == 0) {
        htable_free_all_planes(htable);
      }
      else if (1 < iVar1) {
        pvVar3 = htable->planes[iVar1 - 2U];
        __ptr = htable->planes[iVar1 - 1U];
        uVar10 = 0;
        do {
          plVar4 = *(long **)((long)__ptr + uVar10 * 8);
          if (plVar4 != (long *)0x0) {
            uVar11 = uVar10 % (ulong)(long)(0x3b << ((byte)(iVar1 - 2U) & 0x1f));
            lVar5 = *(long *)((long)pvVar3 + uVar11 * 8);
            if (lVar5 != 0) {
              do {
                plVar14 = plVar4;
                plVar4 = (long *)*plVar14;
              } while (plVar4 != (long *)0x0);
              *plVar14 = lVar5;
            }
            *(undefined8 *)((long)pvVar3 + uVar11 * 8) = *(undefined8 *)((long)__ptr + uVar10 * 8);
          }
          uVar10 = uVar10 + 1;
        } while (uVar10 != (long)(0x3b << ((byte)(iVar1 - 1U) & 0x1f)));
        free(__ptr);
        htable->n_planes = htable->n_planes + -1;
      }
    }
  }
  return local_40;
}

Assistant:

HTABLE_NODE*
htable_remove(HTABLE* htable, const HTABLE_NODE* key,
              HTABLE_CMP_FUNC cmp_func, HTABLE_HASH_FUNC hash_func)
{
    uint32_t hash;
    HTABLE_NODE* node;
    HTABLE_NODE** p_ref;

    hash = hash_func(key);
    node = htable_lookup_internal(htable, hash, key, &p_ref, cmp_func);
    if(node == NULL)
        return NULL;

    *p_ref = node->next;
    htable->n--;

    if(HTABLE_TOO_EMPTY(htable))
        htable_shrink(htable);

    return node;
}